

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall
stringToUnits_partitionMinimumDefault_Test::~stringToUnits_partitionMinimumDefault_Test
          (stringToUnits_partitionMinimumDefault_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(stringToUnits, partitionMinimumDefault)
{
    auto u1 = unit_from_string("mifoot");
    EXPECT_EQ(u1, precise::mile * precise::ft);

    auto prev = setDefaultFlags(minimum_partition_size3);
    EXPECT_EQ(prev, 0ULL);
    EXPECT_EQ(getDefaultFlags(), minimum_partition_size3);

    u1 = unit_from_string("mifoot");
    EXPECT_TRUE(is_error(u1));

    prev = setDefaultFlags(0ULL);
    EXPECT_EQ(prev, minimum_partition_size3);
}